

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O2

int __thiscall KryoFlux::Seek(KryoFlux *this,int cyl)

{
  int iVar1;
  string local_30;
  
  (**(code **)(*(long *)this + 0x18))(&local_30,this,10,cyl,0);
  iVar1 = ResponseCode(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

int KryoFlux::Seek(int cyl)
{
    return ResponseCode(Control(REQ_TRACK, cyl));
}